

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O3

void CB_EXPLORE::predict_or_learn_first<false>(cb_explore *data,single_learner *base,example *ec)

{
  uint32_t uVar1;
  size_t sVar2;
  uint uVar3;
  action_scores probs;
  action_score local_64;
  float local_5c;
  v_array<ACTION_SCORE::action_score> local_58;
  
  local_58._begin._0_4_ = (ec->pred).multiclass;
  local_58._begin._4_4_ = *(undefined4 *)((long)&ec->pred + 4);
  local_58._end._0_4_ = *(undefined4 *)((long)&ec->pred + 8);
  local_58._end._4_4_ = *(undefined4 *)((long)&ec->pred + 0xc);
  local_58.end_array._0_4_ = *(undefined4 *)((long)&ec->pred + 0x10);
  local_58.end_array._4_4_ = *(undefined4 *)((long)&ec->pred + 0x14);
  local_58.erase_count._0_4_ = *(undefined4 *)((long)&ec->pred + 0x18);
  local_58.erase_count._4_4_ = *(undefined4 *)((long)&ec->pred + 0x1c);
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20));
  v_array<ACTION_SCORE::action_score>::clear(&local_58);
  sVar2 = data->tau;
  if (sVar2 == 0) {
    uVar1 = (ec->pred).multiclass;
    if ((data->cbcs).num_actions != 0) {
      uVar3 = 0;
      do {
        local_64.score = 0.0;
        local_64.action = uVar3;
        v_array<ACTION_SCORE::action_score>::push_back(&local_58,&local_64);
        uVar3 = uVar3 + 1;
      } while (uVar3 < (data->cbcs).num_actions);
    }
    *(undefined4 *)
     (CONCAT44(local_58._begin._4_4_,(uint32_t)local_58._begin) + 4 + (ulong)(uVar1 - 1) * 8) =
         0x3f800000;
  }
  else {
    uVar3 = (data->cbcs).num_actions;
    if (uVar3 != 0) {
      local_5c = 1.0 / (float)uVar3;
      uVar3 = 0;
      do {
        local_64.score = local_5c;
        local_64.action = uVar3;
        v_array<ACTION_SCORE::action_score>::push_back(&local_58,&local_64);
        uVar3 = uVar3 + 1;
      } while (uVar3 < (data->cbcs).num_actions);
      sVar2 = data->tau;
    }
    data->tau = sVar2 - 1;
  }
  (ec->pred).scalars.end_array =
       (float *)CONCAT44(local_58.end_array._4_4_,local_58.end_array._0_4_);
  (ec->pred).scalars.erase_count =
       CONCAT44(local_58.erase_count._4_4_,(undefined4)local_58.erase_count);
  (ec->pred).scalars._begin = (float *)CONCAT44(local_58._begin._4_4_,(uint32_t)local_58._begin);
  (ec->pred).scalars._end = (float *)CONCAT44(local_58._end._4_4_,local_58._end._0_4_);
  return;
}

Assistant:

void predict_or_learn_first(cb_explore& data, single_learner& base, example& ec)
{
  // Explore tau times, then act according to optimal.
  action_scores probs = ec.pred.a_s;

  if (is_learn && ec.l.cb.costs[0].probability < 1)
    base.learn(ec);
  else
    base.predict(ec);

  probs.clear();
  if (data.tau > 0)
  {
    float prob = 1.f / (float)data.cbcs.num_actions;
    for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, prob});
    data.tau--;
  }
  else
  {
    uint32_t chosen = ec.pred.multiclass - 1;
    for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, 0.});
    probs[chosen].score = 1.0;
  }

  ec.pred.a_s = probs;
}